

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O3

Name __thiscall wasm::WasmBinaryReader::getInlineString(WasmBinaryReader *this,bool requireValid)

{
  bool bVar1;
  uint32_t uVar2;
  undefined1 in_CL;
  undefined7 in_register_00000031;
  string_view sVar3;
  string_view str;
  string_view s;
  string local_48;
  
  uVar2 = getU32LEB(this);
  sVar3 = getByteView(this,(ulong)uVar2);
  str._M_str = sVar3._M_str;
  if ((int)CONCAT71(in_register_00000031,requireValid) != 0) {
    str._M_len = (size_t)str._M_str;
    bVar1 = String::isUTF8((String *)sVar3._M_len,str);
    if (!bVar1) {
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"invalid UTF-8 string","")
      ;
      throwError(this,&local_48);
    }
  }
  s._M_str = (char *)0x0;
  s._M_len = (size_t)str._M_str;
  sVar3 = IString::interned((IString *)sVar3._M_len,s,(bool)in_CL);
  return (IString)(IString)sVar3;
}

Assistant:

Name WasmBinaryReader::getInlineString(bool requireValid) {
  auto len = getU32LEB();
  auto data = getByteView(len);
  if (requireValid && !String::isUTF8(data)) {
    throwError("invalid UTF-8 string");
  }
  return Name(data);
}